

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<4UL>
mserialize::cx_strcat<2ul,1ul,1ul>
          (cx_string<2UL> *strings,cx_string<1UL> *strings_1,cx_string<1UL> *strings_2)

{
  cx_string<4UL> cVar1;
  char *pcVar2;
  size_t i;
  long lVar3;
  ulong uVar4;
  char buffer [5];
  size_t size [4];
  char *data [4];
  
  pcVar2 = buffer;
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  data[1] = strings->_data;
  data[2] = strings_1->_data;
  data[3] = strings_2->_data;
  size[1] = 2;
  lVar3 = 1;
  size[2] = 1;
  size[3] = 1;
  do {
    if (size[lVar3] != 0) {
      uVar4 = 0;
      do {
        pcVar2[uVar4] = data[lVar3][uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar4 < size[lVar3]);
      pcVar2 = pcVar2 + uVar4;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  cVar1._data[4] = '\0';
  cVar1._data[0] = buffer[0];
  cVar1._data[1] = buffer[1];
  cVar1._data[2] = buffer[2];
  cVar1._data[3] = buffer[3];
  return (cx_string<4UL>)cVar1._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}